

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HD44780SimulationDataGenerator.cpp
# Opt level: O2

void __thiscall HD44780SimulationDataGenerator::Output(HD44780SimulationDataGenerator *this)

{
  undefined4 uVar1;
  uint uVar2;
  char s1 [256];
  
  DoTransfer(this,false,false,'\x01');
  uVar2 = (int)this + 0x18;
  SimulationChannelDescriptorGroup::AdvanceAll(uVar2);
  builtin_strncpy(s1,"Hello World",0xc);
  DoTransferString(this,false,s1);
  if (this->mRW != (SimulationChannelDescriptor *)0x0) {
    DoTransfer(this,false,true,'\v');
    SimulationChannelDescriptorGroup::AdvanceAll(uVar2);
  }
  DoTransfer(this,false,false,0x8f);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar2);
  this->value = this->value + 1;
  sprintf(s1,"%u");
  DoTransferString(this,false,s1);
  if (this->mRW != (SimulationChannelDescriptor *)0x0) {
    DoTransfer(this,false,false,0x80);
    SimulationChannelDescriptorGroup::AdvanceAll(uVar2);
    builtin_strncpy(s1,"Hello",6);
    uVar1 = s1._0_4_;
    s1._0_8_ = CONCAT44(s1._4_4_,uVar1);
    DoTransferString(this,true,s1);
  }
  SimulationChannelDescriptorGroup::AdvanceAll(uVar2);
  return;
}

Assistant:

void HD44780SimulationDataGenerator::Output()
{
    char s1[ 256 ];

    // display clear
    DoTransfer( false, false, _BV( LCD_CLR ) );
    mSimulationChannels.AdvanceAll( TimeToSamplesOrMore( mSettings->mBusyTimeClearHome * ( 1 + TIMING_MARGIN ) / _US ) );

    // write data ("Hello World")
    strcpy( s1, LCD_MESSAGE_WRITE );
    DoTransferString( false, s1 );

    // if (rw) read busy flag/address
    if( mRW != NULL )
    {
        DoTransfer( false, true, strlen( LCD_MESSAGE_WRITE ) );
        mSimulationChannels.AdvanceAll( TimeToSamplesOrMore( mSettings->mBusyTimeCmdChar * ( 1 + TIMING_MARGIN ) / _US ) );
    }

    // set ddram addr 15
    DoTransfer( false, false, _BV( LCD_DDRAM ) | 15 );
    mSimulationChannels.AdvanceAll( TimeToSamplesOrMore( mSettings->mBusyTimeCmdChar * ( 1 + TIMING_MARGIN ) / _US ) );

    // write data (incrementing integer)
    sprintf( s1, "%u", value++ );
    DoTransferString( false, s1 );

    // if (rw) set ddram addr 0, read 5 characters
    if( mRW != NULL )
    {
        DoTransfer( false, false, _BV( LCD_DDRAM ) );
        mSimulationChannels.AdvanceAll( TimeToSamplesOrMore( mSettings->mBusyTimeCmdChar * ( 1 + TIMING_MARGIN ) / _US ) );

        strcpy( s1, LCD_MESSAGE_READ );
        DoTransferString( true, s1 );
    }

    // delay 1ms
    mSimulationChannels.AdvanceAll( TimeToSamplesOrMore( 1 / _MS ) );
}